

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall QStyleSheetStyle::repolish(QStyleSheetStyle *this,QApplication *app)

{
  long in_FS_OFFSET;
  void *local_30;
  QArrayDataPointer<const_QObject_*> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
  QHash<const_QObject_*,_QList<QCss::StyleRule>_>::keys
            ((QList<const_QObject_*> *)&local_28,&styleSheetCaches->styleRulesCache);
  local_30 = QCoreApplication::self;
  QHash<void_const*,QCss::StyleSheet>::removeImpl<void_const*>
            ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&local_30);
  QHash<const_QObject_*,_QList<QCss::StyleRule>_>::clear(&styleSheetCaches->styleRulesCache);
  QHash<const_QObject_*,_QHash<int,_bool>_>::clear(&styleSheetCaches->hasStyleRuleCache);
  QHash<const_QObject_*,_QHash<int,_QHash<unsigned_long_long,_QRenderRule>_>_>::clear
            (&styleSheetCaches->renderRulesCache);
  updateObjects((QList<const_QObject_*> *)&local_28);
  QArrayDataPointer<const_QObject_*>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::repolish(QApplication *app)
{
    Q_UNUSED(app);
    const QList<const QObject*> allObjects = styleSheetCaches->styleRulesCache.keys();
    styleSheetCaches->styleSheetCache.remove(qApp);
    styleSheetCaches->styleRulesCache.clear();
    styleSheetCaches->hasStyleRuleCache.clear();
    styleSheetCaches->renderRulesCache.clear();
    updateObjects(allObjects);
}